

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

int __thiscall deqp::gls::ub::UniformLayout::getUniformIndex(UniformLayout *this,char *name)

{
  int iVar1;
  pointer pUVar2;
  long lVar3;
  long lVar4;
  
  pUVar2 = (this->uniforms).
           super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->uniforms).
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 6)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(pUVar2->name)._M_dataplus._M_p + lVar4));
      if (iVar1 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pUVar2 = (this->uniforms).
               super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x40;
    } while (lVar3 < (int)((ulong)((long)(this->uniforms).
                                         super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2)
                          >> 6));
  }
  return -1;
}

Assistant:

int UniformLayout::getUniformIndex (const char* name) const
{
	for (int ndx = 0; ndx < (int)uniforms.size(); ndx++)
	{
		if (uniforms[ndx].name == name)
			return ndx;
	}
	return -1;
}